

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-obj-list.c
# Opt level: O3

void object_list_show_subwindow(wchar_t height,wchar_t width)

{
  textblock *tb;
  object_list_t *list;
  
  if (width < L'\x01' || height < L'\x01') {
    return;
  }
  tb = textblock_new();
  list = object_list_shared_instance();
  object_list_reset(list);
  object_list_collect(list);
  object_list_sort(list,object_list_standard_compare);
  object_list_format_textblock(list,tb,height,width,(size_t *)0x0,(size_t *)0x0);
  textui_textblock_place(tb,(region)ZEXT816(0),(char *)0x0);
  textblock_free(tb);
  return;
}

Assistant:

void object_list_show_subwindow(int height, int width)
{
	textblock *tb;
	object_list_t *list;

	if (height < 1 || width < 1)
		return;

	tb = textblock_new();
	list = object_list_shared_instance();

	object_list_reset(list);
	object_list_collect(list);
	object_list_sort(list, object_list_standard_compare);

	/* Draw the list to exactly fit the subwindow. */
	object_list_format_textblock(list, tb, height, width, NULL, NULL);
	textui_textblock_place(tb, SCREEN_REGION, NULL);

	textblock_free(tb);
}